

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxGetClass::Emit(FxGetClass *this,VMFunctionBuilder *build)

{
  uint uVar1;
  ExpEmit EVar2;
  ExpEmit EVar3;
  ExpEmit op;
  undefined4 extraout_var;
  
  EVar2._0_4_ = (*this->Self->_vptr_FxExpression[9])();
  EVar2.Konst = (bool)(char)extraout_var;
  EVar2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  op = EVar2;
  ExpEmit::Free(&op,build);
  uVar1 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
  VMFunctionBuilder::Emit(build,0xb,uVar1 & 0xffff,(VM_SHALF)EVar2._0_4_);
  EVar3._0_4_ = uVar1 & 0xffff | 0x1030000;
  EVar3.Konst = false;
  EVar3.Fixed = false;
  EVar3.Final = false;
  EVar3.Target = false;
  return EVar3;
}

Assistant:

ExpEmit FxGetClass::Emit(VMFunctionBuilder *build)
{
	ExpEmit op = Self->Emit(build);
	op.Free(build);
	ExpEmit to(build, REGT_POINTER);
	build->Emit(OP_META, to.RegNum, op.RegNum);
	return to;
}